

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

int __thiscall httplib::Server::bind_internal(Server *this,string *host,int port,int socket_flags)

{
  int iVar1;
  socket_t sVar2;
  uint uVar3;
  socklen_t addr_len;
  sockaddr_storage addr;
  socklen_t local_d4;
  _Any_data local_d0;
  code *local_c0;
  sockaddr local_b0 [8];
  
  iVar1 = (*this->_vptr_Server[2])();
  uVar3 = 0xffffffff;
  if ((char)iVar1 != '\0') {
    std::function<void_(int)>::function((function<void_(int)> *)&local_d0,&this->socket_options_);
    sVar2 = create_server_socket(this,host,port,socket_flags,(SocketOptions *)&local_d0);
    LOCK();
    (this->svr_sock_).super___atomic_base<int>._M_i = sVar2;
    UNLOCK();
    if (local_c0 != (code *)0x0) {
      (*local_c0)(&local_d0,&local_d0,__destroy_functor);
    }
    if (((this->svr_sock_).super___atomic_base<int>._M_i != -1) && (uVar3 = port, port == 0)) {
      local_d4 = 0x80;
      iVar1 = getsockname((this->svr_sock_).super___atomic_base<int>._M_i,local_b0,&local_d4);
      uVar3 = 0xffffffff;
      if ((iVar1 != -1) && ((local_b0[0].sa_family == 10 || (local_b0[0].sa_family == 2)))) {
        uVar3 = (uint)(ushort)(local_b0[0].sa_data._0_2_ << 8 |
                              (ushort)local_b0[0].sa_data._0_2_ >> 8);
      }
    }
  }
  return uVar3;
}

Assistant:

inline int Server::bind_internal(const std::string &host, int port,
                                 int socket_flags) {
  if (!is_valid()) { return -1; }

  svr_sock_ = create_server_socket(host, port, socket_flags, socket_options_);
  if (svr_sock_ == INVALID_SOCKET) { return -1; }

  if (port == 0) {
    struct sockaddr_storage addr;
    socklen_t addr_len = sizeof(addr);
    if (getsockname(svr_sock_, reinterpret_cast<struct sockaddr *>(&addr),
                    &addr_len) == -1) {
      return -1;
    }
    if (addr.ss_family == AF_INET) {
      return ntohs(reinterpret_cast<struct sockaddr_in *>(&addr)->sin_port);
    } else if (addr.ss_family == AF_INET6) {
      return ntohs(reinterpret_cast<struct sockaddr_in6 *>(&addr)->sin6_port);
    } else {
      return -1;
    }
  } else {
    return port;
  }
}